

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O0

void skiwi::error_label(asmcode *code,string *label_name,runtime_error re)

{
  int local_74 [11];
  ulong local_48;
  operand local_3c [2];
  operation local_34 [2];
  operand local_2c [2];
  operation local_24 [2];
  runtime_error local_1c;
  string *psStack_18;
  runtime_error re_local;
  string *label_name_local;
  asmcode *code_local;
  
  local_24[1] = 0x3e;
  local_1c = re;
  psStack_18 = label_name;
  label_name_local = (string *)code;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string_const&>
            (code,local_24 + 1,label_name);
  local_24[0] = SHL;
  local_2c[1] = 9;
  local_2c[0] = NUMBER;
  local_34[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)label_name_local,local_24,local_2c + 1,local_2c,(int *)(local_34 + 1));
  local_34[0] = OR;
  local_3c[1] = 9;
  local_3c[0] = NUMBER;
  local_48 = (ulong)local_1c;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            ((asmcode *)label_name_local,local_34,local_3c + 1,local_3c,&local_48);
  local_74[10] = 0x55;
  local_74[9] = 9;
  local_74[8] = 0x39;
  local_74[7] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)label_name_local,(operation *)(local_74 + 10),(operand *)(local_74 + 9),
             (operand *)(local_74 + 8),local_74 + 7);
  local_74[6] = 0x49;
  local_74[5] = 9;
  local_74[4] = 0x39;
  local_74[3] = 0x2f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)label_name_local,(operation *)(local_74 + 6),(operand *)(local_74 + 5),
             (operand *)(local_74 + 4),local_74 + 3);
  local_74[2] = 0x2c;
  local_74[1] = 0x23;
  local_74[0] = 0x100;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            ((asmcode *)label_name_local,(operation *)(local_74 + 2),(operand *)(local_74 + 1),
             local_74);
  return;
}

Assistant:

void error_label(asmcode& code, const std::string& label_name, runtime_error re)
  {
  code.add(asmcode::LABEL, label_name);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, (uint64_t)re);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, error_tag);
  code.add(asmcode::JMP, ERROR);
  }